

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O3

void __thiscall
mjs::native_object::do_debug_print_extra
          (native_object *this,wostream *os,int indent_incr,int max_nest,int indent)

{
  gc_vector<mjs::native_object::native_object_property> *pgVar1;
  gc_table *pgVar2;
  gc_table *pgVar3;
  wostream *pwVar4;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
  *this_00;
  wstring indent_string;
  wchar_t *local_80;
  long local_78;
  long local_70 [2];
  gc_table *local_60;
  value local_58;
  
  local_80 = (wchar_t *)local_70;
  std::__cxx11::wstring::_M_construct((ulong)&local_80,indent);
  pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>::
           dereference(&this->native_properties_,(this->super_object).heap_);
  this_00 = &pgVar1->table_;
  pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
           ::dereference(this_00,pgVar1->heap_);
  local_60 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
             ::dereference(this_00,pgVar1->heap_);
  pgVar3 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
           ::dereference(this_00,pgVar1->heap_);
  pgVar2 = pgVar2 + 1;
  pgVar3 = (gc_table *)((long)local_60 + (ulong)pgVar3->length_ * 0x38 + 0x10);
  if (pgVar2 != pgVar3) {
    do {
      pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_80,local_78);
      pwVar4 = std::operator<<(pwVar4,(char *)pgVar2);
      std::operator<<(pwVar4,": ");
      (**(code **)&pgVar2[2].capacity_)(&local_58,this);
      debug_print(os,&local_58,indent_incr,1,indent);
      value::destroy(&local_58);
      std::operator<<(os,"\n");
      pgVar2 = (gc_table *)&pgVar2[3].capacity_;
    } while (pgVar2 != pgVar3);
  }
  if (local_80 != (wchar_t *)local_70) {
    operator_delete(local_80,local_70[0] * 4 + 4);
  }
  return;
}

Assistant:

void native_object::do_debug_print_extra(std::wostream& os, int indent_incr, int max_nest, int indent) const {
    const auto indent_string = std::wstring(indent, ' ');
    for (const auto& p: native_properties_.dereference(heap())) {
        os << indent_string << p.name << ": ";
        mjs::debug_print(os, p.get(*this), indent_incr, 1, indent);
        os << "\n";
    }
    object::do_debug_print_extra(os, indent_incr, max_nest, indent);
}